

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_var_analysis.cpp
# Opt level: O2

void skiwi::free_variable_analysis(Program *prog,environment_map *env)

{
  pointer pvVar1;
  pointer pfVar2;
  Expressions *__range1;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *expr;
  pointer pvVar3;
  free_var_analysis_helper fvah;
  value_type local_98;
  free_var_analysis_helper local_80;
  
  if (prog->global_define_env_allocated == false) {
    __assert_fail("prog.global_define_env_allocated",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/free_var_analysis.cpp"
                  ,0xf1,"void skiwi::free_variable_analysis(Program &, environment_map &)");
  }
  if ((env->
      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0) {
    anon_unknown_26::free_var_analysis_helper::free_var_analysis_helper(&local_80,env);
    pvVar1 = (prog->expressions).
             super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar3 = (prog->expressions).
                  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar1; pvVar3 = pvVar3 + 1)
    {
      local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
      local_98.p_expr = pvVar3;
      std::
      vector<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
      ::push_back(&local_80.expressions,&local_98);
    }
    if (local_80.expressions.
        super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_80.expressions.
        super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      for (; pfVar2 = local_80.expressions.
                      super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1,
          local_80.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
          ._M_impl.super__Vector_impl_data._M_start < pfVar2;
          local_80.expressions.
          super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_80.expressions.
               super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        local_98.p_expr =
             (local_80.expressions.
              super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
              ._M_impl.super__Vector_impl_data._M_start)->p_expr;
        local_98._8_8_ =
             *(undefined8 *)
              &(local_80.expressions.
                super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
                ._M_impl.super__Vector_impl_data._M_start)->state;
        (local_80.expressions.
         super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
         ._M_impl.super__Vector_impl_data._M_start)->state =
             local_80.expressions.
             super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].state;
        (local_80.expressions.
         super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
         ._M_impl.super__Vector_impl_data._M_start)->p_expr = pfVar2->p_expr;
        pfVar2->p_expr = local_98.p_expr;
        local_80.expressions.
        super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].state = local_98.state;
        local_80.expressions.
        super__Vector_base<skiwi::(anonymous_namespace)::free_var_analysis_state,_std::allocator<skiwi::(anonymous_namespace)::free_var_analysis_state>_>
        ._M_impl.super__Vector_impl_data._M_finish = pfVar2;
      }
    }
    anon_unknown_26::free_var_analysis_helper::treat_expressions(&local_80);
    prog->free_variables_analysed = true;
    anon_unknown_26::free_var_analysis_helper::~free_var_analysis_helper(&local_80);
    return;
  }
  __assert_fail("env.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/free_var_analysis.cpp"
                ,0xf2,"void skiwi::free_variable_analysis(Program &, environment_map &)");
}

Assistant:

void free_variable_analysis(Program& prog, environment_map& env)
  {
  assert(prog.global_define_env_allocated);
  assert(env.get());
  //free_var_analysis_visitor fvav;
  //fvav.env = env;  
  //visitor<Program, free_var_analysis_visitor>::visit(prog, &fvav);
  free_var_analysis_helper fvah(env);
  for (auto& expr : prog.expressions)
    fvah.expressions.push_back(&expr);
  std::reverse(fvah.expressions.begin(), fvah.expressions.end());
  fvah.treat_expressions();
  prog.free_variables_analysed = true;
  }